

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan.h
# Opt level: O0

Orphan<capnp::compiler::Declaration::AnnotationApplication> * __thiscall
capnp::Orphanage::newOrphan<capnp::compiler::Declaration::AnnotationApplication>
          (Orphan<capnp::compiler::Declaration::AnnotationApplication> *__return_storage_ptr__,
          Orphanage *this)

{
  BuilderArena *arena;
  CapTableBuilder *capTable;
  StructSize size;
  OrphanBuilder local_38;
  Orphanage *local_18;
  Orphanage *this_local;
  
  arena = this->arena;
  capTable = this->capTable;
  local_18 = this;
  this_local = (Orphanage *)__return_storage_ptr__;
  size = capnp::_::
         structSize<capnp::compiler::Declaration::AnnotationApplication,capnp::compiler::Declaration::AnnotationApplication::_capnpPrivate>
                   ();
  capnp::_::OrphanBuilder::initStruct(&local_38,arena,capTable,size);
  Orphan<capnp::compiler::Declaration::AnnotationApplication>::Orphan
            (__return_storage_ptr__,&local_38);
  capnp::_::OrphanBuilder::~OrphanBuilder(&local_38);
  return __return_storage_ptr__;
}

Assistant:

Orphan<RootType> Orphanage::newOrphan() const {
  return Orphan<RootType>(_::OrphanBuilder::initStruct(arena, capTable, _::structSize<RootType>()));
}